

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StepInterface.h
# Opt level: O2

shared_ptr<Calculator> __thiscall
gurkenlaeufer::detail::ScenarioContext::getFixture<Calculator>(ScenarioContext *this)

{
  long lVar1;
  Calculator *pCVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  vector<std::shared_ptr<gurkenlaeufer::detail::IFixture>,std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>>>
  *in_RSI;
  vector<std::shared_ptr<gurkenlaeufer::detail::IFixture>,_std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>_>_>
  *__range3;
  shared_ptr<gurkenlaeufer::detail::IFixture> *fixture_1;
  long lVar4;
  shared_ptr<Calculator> sVar5;
  shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>_> fixture;
  shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>_> local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  lVar1 = *(long *)(in_RSI + 8);
  for (lVar4 = *(long *)in_RSI; lVar4 != lVar1; lVar4 = lVar4 + 0x10) {
    sVar5 = std::dynamic_pointer_cast<Calculator,gurkenlaeufer::detail::IFixture>
                      ((shared_ptr<gurkenlaeufer::detail::IFixture> *)this);
    _Var3 = sVar5.super___shared_ptr<Calculator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if ((this->_fixtures).
        super__Vector_base<std::shared_ptr<gurkenlaeufer::detail::IFixture>,_std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) goto LAB_0016679a;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &(this->_fixtures).
                super__Vector_base<std::shared_ptr<gurkenlaeufer::detail::IFixture>,_std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::make_shared<gurkenlaeufer::detail::Fixture<Calculator>>();
  std::
  vector<std::shared_ptr<gurkenlaeufer::detail::IFixture>,std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>>>
  ::emplace_back<std::shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>>&>(in_RSI,&local_38);
  _Var3._M_pi = local_38.
                super___shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  pCVar2 = &(local_38.
             super___shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->super_Calculator;
  if (local_38.
      super___shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    pCVar2 = (Calculator *)0x0;
  }
  (this->_fixtures).
  super__Vector_base<std::shared_ptr<gurkenlaeufer::detail::IFixture>,_std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)pCVar2;
  local_38.
  super___shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_fixtures).
  super__Vector_base<std::shared_ptr<gurkenlaeufer::detail::IFixture>,_std::allocator<std::shared_ptr<gurkenlaeufer::detail::IFixture>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)_Var3._M_pi;
  local_38.
  super___shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_38.
              super___shared_ptr<gurkenlaeufer::detail::Fixture<Calculator>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  _Var3._M_pi = extraout_RDX;
LAB_0016679a:
  sVar5.super___shared_ptr<Calculator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  sVar5.super___shared_ptr<Calculator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Calculator>)sVar5.super___shared_ptr<Calculator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> getFixture()
        {
            for (auto& fixture : _fixtures) {
                auto ptr = std::dynamic_pointer_cast<T>(fixture);
                if (ptr != nullptr) {
                    return ptr;
                }
            }

            auto fixture = std::make_shared<Fixture<T>>();
            _fixtures.emplace_back(fixture);
            return fixture;
        }